

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O2

MPP_RET parser_sps(BitReadCtx_t *p_bitctx,H264_SPS_t *cur_sps,H264_DecCtx_t *p_Dec)

{
  MPP_RET MVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  RK_S32 _out;
  
  cur_sps->chroma_format_idc = 1;
  cur_sps->bit_depth_luma_minus8 = 0;
  cur_sps->bit_depth_chroma_minus8 = 0;
  cur_sps->qpprime_y_zero_transform_bypass_flag = 0;
  cur_sps->separate_colour_plane_flag = 0;
  cur_sps->log2_max_pic_order_cnt_lsb_minus4 = 0;
  cur_sps->delta_pic_order_always_zero_flag = 0;
  (p_Dec->errctx).un_spt_flag = 0;
  MVar1 = mpp_read_bits(p_bitctx,8,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->profile_idc = _out;
  if ((((0x3e < _out - 0x42U) || ((0x4110100400400801U >> ((ulong)(_out - 0x42U) & 0x3f) & 1) == 0))
      && (_out != 0x2c)) && (_out != 0xf4)) {
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_ERR_VALUE;
    }
    uVar3 = 0xc6;
LAB_00189b00:
    _mpp_log_l(4,"h264d_sps","value error(%d).\n",(char *)0x0,uVar3);
    return MPP_ERR_VALUE;
  }
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->constrained_set0_flag = _out;
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->constrained_set1_flag = _out;
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->constrained_set2_flag = _out;
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->constrained_set3_flag = _out;
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->constrained_set4_flag = _out;
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->constrained_set5_flag = _out;
  MVar1 = mpp_read_bits(p_bitctx,2,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  if (((((byte)h264d_debug & 2) != 0) && (_out != 0)) &&
     (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,"temp == 0","parser_sps"
                 ,0xce), (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0018a2e0;
  MVar1 = mpp_read_bits(p_bitctx,8,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->level_idc = _out;
  MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->seq_parameter_set_id = _out;
  if (0x1f < (uint)_out) {
    cur_sps->seq_parameter_set_id = 0;
  }
  iVar2 = cur_sps->profile_idc;
  if (((iVar2 - 0x53U < 0x38) && ((0x80208808020009U >> ((ulong)(iVar2 - 0x53U) & 0x3f) & 1) != 0))
     || ((iVar2 == 0xf4 || (iVar2 == 0x2c)))) {
    MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->chroma_format_idc = _out;
    if (3 < _out) {
      if (((byte)h264d_debug & 4) == 0) {
        return MPP_ERR_VALUE;
      }
      uVar3 = 0xdb;
      goto LAB_00189b00;
    }
    if (_out == 3) {
      if (((byte)h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_sps","ERROR: Not support chroma_format_idc %d",(char *)0x0,3);
      }
LAB_00189c39:
      (p_Dec->errctx).un_spt_flag = 2;
      return MPP_ERR_UNKNOW;
    }
    MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->bit_depth_luma_minus8 = _out;
    if ((6 < _out && ((byte)h264d_debug & 2) != 0) &&
       (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "cur_sps->bit_depth_luma_minus8 < 7","parser_sps",0xe3),
       (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0018a2e0;
    MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->bit_depth_chroma_minus8 = _out;
    if ((6 < _out && ((byte)h264d_debug & 2) != 0) &&
       (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "cur_sps->bit_depth_chroma_minus8 < 7","parser_sps",0xe5),
       (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0018a2e0;
    MVar1 = mpp_read_bits(p_bitctx,1,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->qpprime_y_zero_transform_bypass_flag = _out;
    if (_out == 1) {
      if (((byte)h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_sps","ERROR: Not support high 4:4:4 lossless mode",(char *)0x0);
      }
      goto LAB_00189c39;
    }
    MVar1 = mpp_read_bits(p_bitctx,1,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->seq_scaling_matrix_present_flag = _out;
    if (_out != 0) {
      if (((byte)h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_sps","Scaling matrix present.",(char *)0x0);
      }
      MVar1 = parse_sps_scalinglists(p_bitctx,cur_sps);
      if (MVar1 != MPP_OK) {
        _mpp_log_l(4,"h264d_sps"," parse_sps_scaling_list error.","parser_sps");
      }
    }
  }
  MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->log2_max_frame_num_minus4 = _out;
  if ((0xc < _out && ((byte)h264d_debug & 2) != 0) &&
     (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "cur_sps->log2_max_frame_num_minus4 < 13","parser_sps",0xf5),
     (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_0018a2e0:
    abort();
  }
  MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->pic_order_cnt_type = _out;
  iVar2 = _out;
  if (2 < _out && ((byte)h264d_debug & 2) != 0) {
    _mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
               "cur_sps->pic_order_cnt_type < 3","parser_sps",0xf7);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0018a2e0;
    iVar2 = cur_sps->pic_order_cnt_type;
  }
  cur_sps->log2_max_pic_order_cnt_lsb_minus4 = 0;
  cur_sps->delta_pic_order_always_zero_flag = 0;
  if (iVar2 == 1) {
    MVar1 = mpp_read_bits(p_bitctx,1,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->delta_pic_order_always_zero_flag = _out;
    MVar1 = mpp_read_se(p_bitctx,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->offset_for_non_ref_pic = _out;
    MVar1 = mpp_read_se(p_bitctx,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->offset_for_top_to_bottom_field = _out;
    MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->num_ref_frames_in_pic_order_cnt_cycle = _out;
    if (0xff < _out) {
      if (((byte)h264d_debug & 4) == 0) {
        return MPP_ERR_VALUE;
      }
      uVar3 = 0x103;
      goto LAB_00189b00;
    }
    iVar2 = _out;
    for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
      MVar1 = mpp_read_se(p_bitctx,&_out);
      p_bitctx->ret = MVar1;
      if (MVar1 != MPP_OK) {
        return MVar1;
      }
      cur_sps->offset_for_ref_frame[lVar4] = _out;
      cur_sps->expected_delta_per_pic_order_cnt_cycle =
           cur_sps->expected_delta_per_pic_order_cnt_cycle + _out;
      iVar2 = cur_sps->num_ref_frames_in_pic_order_cnt_cycle;
    }
  }
  else if (iVar2 == 0) {
    MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->log2_max_pic_order_cnt_lsb_minus4 = _out;
    if ((0xc < _out && ((byte)h264d_debug & 2) != 0) &&
       (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "cur_sps->log2_max_pic_order_cnt_lsb_minus4 < 13","parser_sps",0xfd),
       (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0018a2e0;
  }
  MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->max_num_ref_frames = _out;
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->gaps_in_frame_num_value_allowed_flag = _out;
  MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->pic_width_in_mbs_minus1 = _out;
  MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->pic_height_in_map_units_minus1 = _out;
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->frame_mbs_only_flag = _out;
  if (_out == 0) {
    MVar1 = mpp_read_bits(p_bitctx,1,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->mb_adaptive_frame_field_flag = _out;
  }
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->direct_8x8_inference_flag = _out;
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->frame_cropping_flag = _out;
  if (_out != 0) {
    MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->frame_crop_left_offset = _out;
    MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->frame_crop_right_offset = _out;
    MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->frame_crop_top_offset = _out;
    MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) {
      return MVar1;
    }
    cur_sps->frame_crop_bottom_offset = _out;
  }
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  cur_sps->vui_parameters_present_flag = _out;
  if (_out == 0) goto LAB_00189faf;
  (cur_sps->vui_seq_parameters).matrix_coefficients = 2;
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) goto LAB_00189faf;
  (cur_sps->vui_seq_parameters).aspect_ratio_info_present_flag = _out;
  if (_out != 0) {
    MVar1 = mpp_read_bits(p_bitctx,8,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) goto LAB_00189faf;
    (cur_sps->vui_seq_parameters).aspect_ratio_idc = _out;
    if (_out == 0xff) {
      MVar1 = mpp_read_bits(p_bitctx,0x10,&_out);
      p_bitctx->ret = MVar1;
      if (MVar1 != MPP_OK) goto LAB_00189faf;
      (cur_sps->vui_seq_parameters).sar_width = (RK_U16)_out;
      MVar1 = mpp_read_bits(p_bitctx,0x10,&_out);
      p_bitctx->ret = MVar1;
      if (MVar1 != MPP_OK) goto LAB_00189faf;
      (cur_sps->vui_seq_parameters).sar_height = (RK_U16)_out;
    }
  }
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) goto LAB_00189faf;
  (cur_sps->vui_seq_parameters).overscan_info_present_flag = _out;
  if (_out != 0) {
    MVar1 = mpp_read_bits(p_bitctx,1,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) goto LAB_00189faf;
    (cur_sps->vui_seq_parameters).overscan_appropriate_flag = _out;
  }
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) goto LAB_00189faf;
  (cur_sps->vui_seq_parameters).video_signal_type_present_flag = _out;
  if (_out != 0) {
    MVar1 = mpp_read_bits(p_bitctx,3,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) goto LAB_00189faf;
    (cur_sps->vui_seq_parameters).video_format = _out;
    MVar1 = mpp_read_bits(p_bitctx,1,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) goto LAB_00189faf;
    (cur_sps->vui_seq_parameters).video_full_range_flag = _out;
    MVar1 = mpp_read_bits(p_bitctx,1,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) goto LAB_00189faf;
    (cur_sps->vui_seq_parameters).colour_description_present_flag = _out;
    if (_out != 0) {
      MVar1 = mpp_read_bits(p_bitctx,8,&_out);
      p_bitctx->ret = MVar1;
      if (MVar1 != MPP_OK) goto LAB_00189faf;
      (cur_sps->vui_seq_parameters).colour_primaries = _out;
      MVar1 = mpp_read_bits(p_bitctx,8,&_out);
      p_bitctx->ret = MVar1;
      if (MVar1 != MPP_OK) goto LAB_00189faf;
      (cur_sps->vui_seq_parameters).transfer_characteristics = _out;
      MVar1 = mpp_read_bits(p_bitctx,8,&_out);
      p_bitctx->ret = MVar1;
      if (MVar1 != MPP_OK) goto LAB_00189faf;
      (cur_sps->vui_seq_parameters).matrix_coefficients = _out;
      if (0xe < (uint)_out) {
        (cur_sps->vui_seq_parameters).matrix_coefficients = 2;
      }
    }
  }
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) goto LAB_00189faf;
  (cur_sps->vui_seq_parameters).chroma_location_info_present_flag = _out;
  if (_out != 0) {
    MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) goto LAB_00189faf;
    (cur_sps->vui_seq_parameters).chroma_sample_loc_type_top_field = _out;
    MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) goto LAB_00189faf;
    (cur_sps->vui_seq_parameters).chroma_sample_loc_type_bottom_field = _out;
  }
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) goto LAB_00189faf;
  (cur_sps->vui_seq_parameters).timing_info_present_flag = _out;
  if (_out != 0) {
    MVar1 = mpp_read_longbits(p_bitctx,0x20,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) goto LAB_00189faf;
    (cur_sps->vui_seq_parameters).num_units_in_tick = _out;
    MVar1 = mpp_read_longbits(p_bitctx,0x20,(RK_U32 *)&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) goto LAB_00189faf;
    (cur_sps->vui_seq_parameters).time_scale = _out;
    MVar1 = mpp_read_bits(p_bitctx,1,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) goto LAB_00189faf;
    (cur_sps->vui_seq_parameters).fixed_frame_rate_flag = _out;
  }
  MVar1 = mpp_read_bits(p_bitctx,1,&_out);
  p_bitctx->ret = MVar1;
  if (MVar1 != MPP_OK) goto LAB_00189faf;
  (cur_sps->vui_seq_parameters).nal_hrd_parameters_present_flag = _out;
  if (_out == 0) {
    (cur_sps->vui_seq_parameters).nal_hrd_parameters.cpb_cnt_minus1 = 1;
    (cur_sps->vui_seq_parameters).nal_hrd_parameters.bit_rate_value_minus1[0] = 0xe4e1c01;
    (cur_sps->vui_seq_parameters).nal_hrd_parameters.cpb_size_value_minus1[0] = 0xe4e1c01;
    (cur_sps->vui_seq_parameters).nal_hrd_parameters.initial_cpb_removal_delay_length_minus1 = 0x18;
    (cur_sps->vui_seq_parameters).nal_hrd_parameters.cpb_removal_delay_length_minus1 = 0x18;
    (cur_sps->vui_seq_parameters).nal_hrd_parameters.dpb_output_delay_length_minus1 = 0x18;
    (cur_sps->vui_seq_parameters).nal_hrd_parameters.time_offset_length = 0x18;
LAB_0018a66e:
    MVar1 = mpp_read_bits(p_bitctx,1,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 != MPP_OK) goto LAB_00189faf;
    (cur_sps->vui_seq_parameters).vcl_hrd_parameters_present_flag = _out;
    if (_out == 0) {
      (cur_sps->vui_seq_parameters).vcl_hrd_parameters.cpb_cnt_minus1 = 0;
      (cur_sps->vui_seq_parameters).vcl_hrd_parameters.bit_rate_value_minus1[0] = 0xe4e1c01;
      (cur_sps->vui_seq_parameters).vcl_hrd_parameters.cpb_size_value_minus1[0] = 0xe4e1c01;
      (cur_sps->vui_seq_parameters).vcl_hrd_parameters.initial_cpb_removal_delay_length_minus1 =
           0x18;
      (cur_sps->vui_seq_parameters).vcl_hrd_parameters.cpb_removal_delay_length_minus1 = 0x18;
      (cur_sps->vui_seq_parameters).vcl_hrd_parameters.dpb_output_delay_length_minus1 = 0x18;
      (cur_sps->vui_seq_parameters).vcl_hrd_parameters.time_offset_length = 0x18;
    }
    else {
      MVar1 = read_hrd_parameters(p_bitctx,&(cur_sps->vui_seq_parameters).vcl_hrd_parameters);
      if (MVar1 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) goto LAB_00189faf;
        uVar3 = 0x8a;
        goto LAB_0018a6cf;
      }
    }
    if (((cur_sps->vui_seq_parameters).nal_hrd_parameters_present_flag != 0) ||
       ((cur_sps->vui_seq_parameters).vcl_hrd_parameters_present_flag != 0)) {
      MVar1 = mpp_read_bits(p_bitctx,1,&_out);
      p_bitctx->ret = MVar1;
      if (MVar1 != MPP_OK) goto LAB_00189faf;
      (cur_sps->vui_seq_parameters).low_delay_hrd_flag = _out;
    }
    MVar1 = mpp_read_bits(p_bitctx,1,&_out);
    p_bitctx->ret = MVar1;
    if (MVar1 == MPP_OK) {
      (cur_sps->vui_seq_parameters).pic_struct_present_flag = _out;
      MVar1 = mpp_read_bits(p_bitctx,1,&_out);
      p_bitctx->ret = MVar1;
      if ((MVar1 == MPP_OK) &&
         ((cur_sps->vui_seq_parameters).bitstream_restriction_flag = _out, _out != 0)) {
        MVar1 = mpp_read_bits(p_bitctx,1,&_out);
        p_bitctx->ret = MVar1;
        if (MVar1 == MPP_OK) {
          (cur_sps->vui_seq_parameters).motion_vectors_over_pic_boundaries_flag = _out;
          MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
          p_bitctx->ret = MVar1;
          if (MVar1 == MPP_OK) {
            (cur_sps->vui_seq_parameters).max_bytes_per_pic_denom = _out;
            MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
            p_bitctx->ret = MVar1;
            if (MVar1 == MPP_OK) {
              (cur_sps->vui_seq_parameters).max_bits_per_mb_denom = _out;
              MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
              p_bitctx->ret = MVar1;
              if (MVar1 == MPP_OK) {
                (cur_sps->vui_seq_parameters).log2_max_mv_length_horizontal = _out;
                MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
                p_bitctx->ret = MVar1;
                if (MVar1 == MPP_OK) {
                  (cur_sps->vui_seq_parameters).log2_max_mv_length_vertical = _out;
                  MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
                  p_bitctx->ret = MVar1;
                  if (MVar1 == MPP_OK) {
                    (cur_sps->vui_seq_parameters).num_reorder_frames = _out;
                    MVar1 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
                    p_bitctx->ret = MVar1;
                    if (MVar1 == MPP_OK) {
                      (cur_sps->vui_seq_parameters).max_dec_frame_buffering = _out;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    MVar1 = read_hrd_parameters(p_bitctx,&(cur_sps->vui_seq_parameters).nal_hrd_parameters);
    if (MPP_NOK < MVar1) goto LAB_0018a66e;
    if (((byte)h264d_debug & 4) == 0) goto LAB_00189faf;
    uVar3 = 0x7a;
LAB_0018a6cf:
    _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,uVar3);
  }
LAB_00189faf:
  cur_sps->Valid = 1;
  return MPP_OK;
}

Assistant:

static MPP_RET parser_sps(BitReadCtx_t *p_bitctx, H264_SPS_t *cur_sps, H264_DecCtx_t *p_Dec)
{
    RK_S32 i = 0, temp = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    //!< init Fidelity Range Extensions stuff
    cur_sps->chroma_format_idc       = 1;
    cur_sps->bit_depth_luma_minus8   = 0;
    cur_sps->bit_depth_chroma_minus8 = 0;
    cur_sps->qpprime_y_zero_transform_bypass_flag = 0;
    cur_sps->separate_colour_plane_flag           = 0;
    cur_sps->log2_max_pic_order_cnt_lsb_minus4    = 0;
    cur_sps->delta_pic_order_always_zero_flag     = 0;
    p_Dec->errctx.un_spt_flag = 0; // init unspport flag first

    READ_BITS(p_bitctx, 8, &cur_sps->profile_idc);
    VAL_CHECK (ret, (cur_sps->profile_idc == H264_PROFILE_BASELINE)
               || (cur_sps->profile_idc == H264_PROFILE_MAIN)
               || (cur_sps->profile_idc == H264_PROFILE_EXTENDED)
               || (cur_sps->profile_idc == H264_PROFILE_HIGH)
               || (cur_sps->profile_idc == H264_PROFILE_HIGH10)
               || (cur_sps->profile_idc == H264_PROFILE_HIGH422)
               || (cur_sps->profile_idc == H264_PROFILE_HIGH444)
               || (cur_sps->profile_idc == H264_PROFILE_FREXT_CAVLC444)
               || (cur_sps->profile_idc == H264_PROFILE_MVC_HIGH)
               || (cur_sps->profile_idc == H264_PROFILE_STEREO_HIGH)
              );
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set0_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set1_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set2_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set3_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set4_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set5_flag);
    READ_BITS(p_bitctx, 2, &temp);  //!< reserved_zero_2bits
    ASSERT(temp == 0);
    READ_BITS(p_bitctx, 8, &cur_sps->level_idc);
    READ_UE(p_bitctx, &cur_sps->seq_parameter_set_id);
    if (cur_sps->seq_parameter_set_id >= MAXSPS) {
        cur_sps->seq_parameter_set_id = 0;
    }
    if (cur_sps->profile_idc == 100 || cur_sps->profile_idc == 110
        || cur_sps->profile_idc == 122 || cur_sps->profile_idc == 244
        || cur_sps->profile_idc == 44  || cur_sps->profile_idc == 83
        || cur_sps->profile_idc == 86  || cur_sps->profile_idc == 118
        || cur_sps->profile_idc == 128 || cur_sps->profile_idc == 138) {
        READ_UE(p_bitctx, &cur_sps->chroma_format_idc);
        /* check invalid chroma format idc */
        VAL_CHECK (ret, (cur_sps->chroma_format_idc <= H264_CHROMA_444));
        /* TODO: check unsupport chroma format by hardware capacity */
        if (cur_sps->chroma_format_idc > H264_CHROMA_422) {
            H264D_ERR("ERROR: Not support chroma_format_idc %d", cur_sps->chroma_format_idc);
            p_Dec->errctx.un_spt_flag = MPP_FRAME_ERR_UNSUPPORT;
            goto __FAILED;
        }
        READ_UE(p_bitctx, &cur_sps->bit_depth_luma_minus8);
        ASSERT(cur_sps->bit_depth_luma_minus8 < 7);
        READ_UE(p_bitctx, &cur_sps->bit_depth_chroma_minus8);
        ASSERT(cur_sps->bit_depth_chroma_minus8 < 7);
        READ_ONEBIT(p_bitctx, &cur_sps->qpprime_y_zero_transform_bypass_flag);
        if (cur_sps->qpprime_y_zero_transform_bypass_flag == 1) {
            H264D_ERR("ERROR: Not support high 4:4:4 lossless mode");
            p_Dec->errctx.un_spt_flag = MPP_FRAME_ERR_UNSUPPORT;
            goto __FAILED;
        }
        READ_ONEBIT(p_bitctx, &cur_sps->seq_scaling_matrix_present_flag);
        if (cur_sps->seq_scaling_matrix_present_flag) {
            H264D_WARNNING("Scaling matrix present.");
            if (parse_sps_scalinglists(p_bitctx, cur_sps)) {
                mpp_log_f(" parse_sps_scaling_list error.");
            }
        }
    }
    READ_UE(p_bitctx, &cur_sps->log2_max_frame_num_minus4);
    ASSERT(cur_sps->log2_max_frame_num_minus4 < 13);
    READ_UE(p_bitctx, &cur_sps->pic_order_cnt_type);
    ASSERT(cur_sps->pic_order_cnt_type < 3);

    cur_sps->log2_max_pic_order_cnt_lsb_minus4 = 0;
    cur_sps->delta_pic_order_always_zero_flag = 0;
    if (0 == cur_sps->pic_order_cnt_type) {
        READ_UE(p_bitctx, &cur_sps->log2_max_pic_order_cnt_lsb_minus4);
        ASSERT(cur_sps->log2_max_pic_order_cnt_lsb_minus4 < 13);
    } else if (1 == cur_sps->pic_order_cnt_type) {
        READ_ONEBIT(p_bitctx, &cur_sps->delta_pic_order_always_zero_flag);
        READ_SE(p_bitctx, &cur_sps->offset_for_non_ref_pic);
        READ_SE(p_bitctx, &cur_sps->offset_for_top_to_bottom_field);
        READ_UE(p_bitctx, &cur_sps->num_ref_frames_in_pic_order_cnt_cycle);
        VAL_CHECK(ret, cur_sps->num_ref_frames_in_pic_order_cnt_cycle < 256);
        for (i = 0; i < cur_sps->num_ref_frames_in_pic_order_cnt_cycle; ++i) {
            READ_SE(p_bitctx, &cur_sps->offset_for_ref_frame[i]);
            cur_sps->expected_delta_per_pic_order_cnt_cycle += cur_sps->offset_for_ref_frame[i];
        }
    }
    READ_UE(p_bitctx, &cur_sps->max_num_ref_frames);
    READ_ONEBIT(p_bitctx, &cur_sps->gaps_in_frame_num_value_allowed_flag);
    READ_UE(p_bitctx, &cur_sps->pic_width_in_mbs_minus1);
    READ_UE(p_bitctx, &cur_sps->pic_height_in_map_units_minus1);
    READ_ONEBIT(p_bitctx, &cur_sps->frame_mbs_only_flag);
    if (!cur_sps->frame_mbs_only_flag) {
        READ_ONEBIT(p_bitctx, &cur_sps->mb_adaptive_frame_field_flag);
    }
    READ_ONEBIT(p_bitctx, &cur_sps->direct_8x8_inference_flag);

    READ_ONEBIT(p_bitctx, &cur_sps->frame_cropping_flag);
    if (cur_sps->frame_cropping_flag) {
        READ_UE(p_bitctx, &cur_sps->frame_crop_left_offset);
        READ_UE(p_bitctx, &cur_sps->frame_crop_right_offset);
        READ_UE(p_bitctx, &cur_sps->frame_crop_top_offset);
        READ_UE(p_bitctx, &cur_sps->frame_crop_bottom_offset);
    }
    READ_ONEBIT(p_bitctx, &cur_sps->vui_parameters_present_flag);

    if (cur_sps->vui_parameters_present_flag) {
        init_VUI(&cur_sps->vui_seq_parameters);
        ret = read_VUI(p_bitctx, &cur_sps->vui_seq_parameters);
    }
    cur_sps->Valid = 1;
    (void)p_Dec;

    return ret = MPP_OK;
__BITREAD_ERR:
    ret = p_bitctx->ret;
__FAILED:
    return ret;
}